

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::applyProtectPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  TokenKind kind;
  size_t sVar1;
  bool bVar2;
  SyntaxNode *pSVar3;
  SourceLocation SVar4;
  SyntaxNode *pSVar5;
  SimplePragmaExpressionSyntax *simple;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  SourceRange range;
  string_view sVar7;
  Token keyword;
  const_iterator __begin2;
  anon_class_16_2_cfeedcd7 handle;
  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> local_50;
  Token local_40;
  undefined8 uVar6;
  
  sVar1 = (pragma->args).elements._M_extent._M_extent_value;
  if (sVar1 == 0) {
    local_40 = syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar4 = Token::location(&local_40);
    sVar7 = Token::rawText(&local_40);
    addDiag(this,(DiagCode)0x200004,(SourceLocation)((long)SVar4 + sVar7._M_len * 0x10000000));
  }
  else {
    local_40.info = (Info *)skippedTokens;
    local_40._0_8_ = this;
    local_50.list = &pragma->args;
    for (local_50.index = 0; local_50.list != &pragma->args || local_50.index != sVar1 + 1 >> 1;
        local_50.index = local_50.index + 1) {
      pSVar3 = &syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::dereference(&local_50)
                ->super_SyntaxNode;
      if (pSVar3->kind == NameValuePragmaExpression) {
        uVar6 = *(undefined8 *)(pSVar3 + 1);
        pSVar5 = pSVar3[1].parent;
        pSVar3 = pSVar3[2].parent;
LAB_001f0165:
        keyword.info = (Info *)pSVar5;
        keyword.kind = (short)uVar6;
        keyword._2_1_ = (char)((ulong)uVar6 >> 0x10);
        keyword.numFlags.raw = (char)((ulong)uVar6 >> 0x18);
        keyword.rawLen = (int)((ulong)uVar6 >> 0x20);
        applyProtectPragma::anon_class_16_2_cfeedcd7::operator()
                  ((anon_class_16_2_cfeedcd7 *)&local_40,keyword,(PragmaExpressionSyntax *)pSVar3);
      }
      else {
        if (pSVar3->kind == SimplePragmaExpression) {
          kind = (TokenKind)pSVar3[1].kind;
          if (kind != Identifier) {
            bVar2 = LexerFacts::isKeyword(kind);
            if (!bVar2) goto LAB_001f0139;
          }
          uVar6 = *(undefined8 *)(pSVar3 + 1);
          pSVar5 = pSVar3[1].parent;
          pSVar3 = (SyntaxNode *)0x0;
          goto LAB_001f0165;
        }
LAB_001f0139:
        range = syntax::SyntaxNode::sourceRange(pSVar3);
        addDiag(this,(DiagCode)0x200004,range);
      }
    }
  }
  return;
}

Assistant:

void Preprocessor::applyProtectPragma(const PragmaDirectiveSyntax& pragma,
                                      SmallVectorBase<Token>& skippedTokens) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedProtectKeyword, last.location() + last.rawText().length());
        return;
    }

    auto handle = [&](Token keyword, const PragmaExpressionSyntax* args) {
        auto text = keyword.valueText();
        if (auto it = pragmaProtectHandlers.find(text); it != pragmaProtectHandlers.end())
            (this->*(it->second))(keyword, args, skippedTokens);
        else if (!text.empty())
            addDiag(diag::UnknownProtectKeyword, keyword.range()) << text;
    };

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier ||
                LexerFacts::isKeyword(simple.value.kind)) {
                handle(simple.value, nullptr);
                continue;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
            handle(nvp.name, nvp.value);
            continue;
        }

        addDiag(diag::ExpectedProtectKeyword, arg->sourceRange());
    }
}